

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Tensor::SerializeWithCachedSizes(Tensor *this,CodedOutputStream *output)

{
  uint32 uVar1;
  int iVar2;
  int64 value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Tensor *this_local;
  
  uVar1 = rank(this);
  if (uVar1 != 0) {
    uVar1 = rank(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar1,output);
  }
  iVar2 = dimvalue_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_dimvalue_cached_byte_size_)
    ;
  }
  local_20 = 0;
  iVar2 = dimvalue_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    value = dimvalue(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(value,output);
  }
  return;
}

Assistant:

void Tensor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Tensor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 rank = 1;
  if (this->rank() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->rank(), output);
  }

  // repeated int64 dimValue = 2;
  if (this->dimvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dimvalue_cached_byte_size_);
  }
  for (int i = 0, n = this->dimvalue_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->dimvalue(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Tensor)
}